

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void increase_score(tgestate_t *state,uint8_t delta)

{
  char cVar1;
  char *tmp;
  char *pcVar2;
  
  pcVar2 = state->score_digits + 4;
  do {
    for (; cVar1 = *pcVar2, *pcVar2 = cVar1 + '\x01', '\t' < (char)(cVar1 + '\x01');
        pcVar2 = pcVar2 + -1) {
      *pcVar2 = '\0';
    }
    delta = delta + 0xff;
    pcVar2 = state->score_digits + 4;
  } while (delta != '\0');
  plot_score(state);
  return;
}

Assistant:

void increase_score(tgestate_t *state, uint8_t delta)
{
  char *pdigit; /* was HL */

  assert(state != NULL);
  assert(delta > 0);

  /* Increment the score digit-wise until delta is zero. */

  assert(state->score_digits[0] <= 9);
  assert(state->score_digits[1] <= 9);
  assert(state->score_digits[2] <= 9);
  assert(state->score_digits[3] <= 9);
  assert(state->score_digits[4] <= 9);

  pdigit = &state->score_digits[4];
  do
  {
    char *tmp; /* was HL */

    tmp = pdigit;
    for (;;)
    {
      (*pdigit)++;
      if (*pdigit < 10)
        break;

      *pdigit-- = 0;
    }
    pdigit = tmp;
  }
  while (--delta);

  plot_score(state);
}